

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_textures(HL1MDLLoader *this)

{
  Header_HL1 *pHVar1;
  aiScene *paVar2;
  uint uVar3;
  aiTexture **ppaVar4;
  aiMaterial **ppaVar5;
  aiTexture *paVar6;
  aiMaterial *this_00;
  size_t __n;
  HL1MDLLoader *this_01;
  Texture_HL1 *ptexture;
  long lVar7;
  aiShadingMode shading_mode;
  HL1MDLLoader *local_478;
  aiColor3D local_470;
  uchar *local_460;
  int chrome;
  undefined4 uStack_454;
  ulong local_450;
  aiString texture_name;
  
  pHVar1 = this->texture_header_;
  ptexture = (Texture_HL1 *)((pHVar1->super_HalfLifeMDLBaseHeader).ident + pHVar1->textureindex);
  local_460 = this->texture_buffer_;
  uVar3 = pHVar1->numtextures;
  this->scene_->mNumMaterials = uVar3;
  this->scene_->mNumTextures = uVar3;
  paVar2 = this->scene_;
  ppaVar4 = (aiTexture **)operator_new__((ulong)paVar2->mNumTextures << 3);
  paVar2->mTextures = ppaVar4;
  paVar2 = this->scene_;
  ppaVar5 = (aiMaterial **)operator_new__((ulong)paVar2->mNumMaterials << 3);
  paVar2->mMaterials = ppaVar5;
  local_478 = this;
  for (lVar7 = 0; lVar7 < this->texture_header_->numtextures; lVar7 = lVar7 + 1) {
    paVar6 = (aiTexture *)operator_new(0x428);
    paVar6->mWidth = 0;
    paVar6->mHeight = 0;
    paVar6->pcData = (aiTexel *)0x0;
    (paVar6->mFilename).length = 0;
    (paVar6->mFilename).data[0] = '\0';
    this_01 = (HL1MDLLoader *)((paVar6->mFilename).data + 1);
    memset(this_01,0x1b,0x3ff);
    paVar6->achFormatHint[0] = '\0';
    paVar6->achFormatHint[1] = '\0';
    paVar6->achFormatHint[2] = '\0';
    paVar6->achFormatHint[3] = '\0';
    this->scene_->mTextures[lVar7] = paVar6;
    local_470.r = 0.0;
    local_470.g = 0.0;
    local_470.b = 0.0;
    read_texture(this_01,ptexture,local_460 + ptexture->index,
                 local_460 + ptexture->index + (long)ptexture->height * (long)ptexture->width,
                 this->scene_->mTextures[lVar7],&local_470);
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    this->scene_->mMaterials[lVar7] = this_00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&chrome,ptexture->name,(allocator<char> *)&shading_mode);
    __n = local_450 & 0xffffffff;
    if ((local_450 & 0xfffffc00) != 0) {
      __n = 0x3ff;
    }
    texture_name.length = (ai_uint32)__n;
    memcpy(texture_name.data,(void *)CONCAT44(uStack_454,chrome),__n);
    texture_name.data[__n] = '\0';
    std::__cxx11::string::~string((string *)&chrome);
    aiMaterial::AddProperty(this_00,&texture_name,"$tex.file",1,0);
    chrome = (uint)ptexture->flags >> 1 & 1;
    aiMaterial::AddProperty(this_00,&chrome,1,"$mat.HL1.chrome",1,0);
    uVar3 = ptexture->flags;
    if ((uVar3 & 1) != 0) {
      shading_mode = aiShadingMode_Flat;
      aiMaterial::AddProperty<aiShadingMode>(this_00,&shading_mode,1,"$mat.shadingm",0,0);
      uVar3 = ptexture->flags;
    }
    this = local_478;
    if ((uVar3 & 0x20) == 0) {
      if ((uVar3 & 0x40) != 0) {
        shading_mode = aiShadingMode_Gouraud;
        aiMaterial::AddProperty<aiTextureFlags>
                  (this_00,(aiTextureFlags *)&shading_mode,1,"$tex.flags",1,0);
        aiMaterial::AddProperty(this_00,&local_470,1,"$clr.transparent",0,0);
      }
    }
    else {
      shading_mode = aiShadingMode_Flat;
      aiMaterial::AddProperty<aiBlendMode>(this_00,(aiBlendMode *)&shading_mode,1,"$mat.blend",0,0);
      this = local_478;
    }
    ptexture = ptexture + 1;
  }
  return;
}

Assistant:

void HL1MDLLoader::read_textures() {
    const Texture_HL1 *ptexture = (const Texture_HL1 *)((uint8_t *)texture_header_ + texture_header_->textureindex);
    unsigned char *pin = texture_buffer_;

    scene_->mNumTextures = scene_->mNumMaterials = texture_header_->numtextures;
    scene_->mTextures = new aiTexture *[scene_->mNumTextures];
    scene_->mMaterials = new aiMaterial *[scene_->mNumMaterials];

    for (int i = 0; i < texture_header_->numtextures; ++i) {
        scene_->mTextures[i] = new aiTexture();

        aiColor3D last_palette_color;
        read_texture(&ptexture[i],
                pin + ptexture[i].index,
                pin + ptexture[i].width * ptexture[i].height + ptexture[i].index,
                scene_->mTextures[i],
                last_palette_color);

        aiMaterial *scene_material = scene_->mMaterials[i] = new aiMaterial();

        const aiTextureType texture_type = aiTextureType_DIFFUSE;
        aiString texture_name(ptexture[i].name);
        scene_material->AddProperty(&texture_name, AI_MATKEY_TEXTURE(texture_type, 0));

        // Is this a chrome texture?
        int chrome = ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_CHROME ? 1 : 0;
        scene_material->AddProperty(&chrome, 1, AI_MDL_HL1_MATKEY_CHROME(texture_type, 0));

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_FLATSHADE) {
            // Flat shading.
            const aiShadingMode shading_mode = aiShadingMode_Flat;
            scene_material->AddProperty(&shading_mode, 1, AI_MATKEY_SHADING_MODEL);
        }

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_ADDITIVE) {
            // Additive texture.
            const aiBlendMode blend_mode = aiBlendMode_Additive;
            scene_material->AddProperty(&blend_mode, 1, AI_MATKEY_BLEND_FUNC);
        } else if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_MASKED) {
            // Texture with 1 bit alpha test.
            const aiTextureFlags use_alpha = aiTextureFlags_UseAlpha;
            scene_material->AddProperty(&use_alpha, 1, AI_MATKEY_TEXFLAGS(texture_type, 0));
            scene_material->AddProperty(&last_palette_color, 1, AI_MATKEY_COLOR_TRANSPARENT);
        }
    }
}